

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger thread_getstackinfos(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectValue v_00;
  SQObjectPtr *pSVar2;
  SQInteger newtop;
  SQInteger SVar3;
  SQRESULT SVar4;
  SQObjectPtr o;
  SQInteger level;
  SQObject local_38;
  SQInteger local_20;
  
  pSVar2 = SQVM::GetAt(v,v->_stackbase);
  local_38._type = (pSVar2->super_SQObject)._type;
  local_38._flags = (pSVar2->super_SQObject)._flags;
  local_38._5_3_ = *(undefined3 *)&(pSVar2->super_SQObject).field_0x5;
  v_00 = (SQObjectValue)(pSVar2->super_SQObject)._unVal.pTable;
  if ((local_38._type >> 0x1b & 1) != 0) {
    pSVar1 = &((v_00.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_38._unVal = v_00;
  if (local_38._type == OT_THREAD) {
    newtop = sq_gettop((HSQUIRRELVM)v_00.pTable);
    sq_getinteger(v,-1,&local_20);
    SVar3 = __sq_getcallstackinfos((HSQUIRRELVM)v_00.pTable,local_20);
    if (SVar3 == 0) {
      sq_settop((HSQUIRRELVM)v_00.pTable,newtop);
      SVar4 = 0;
    }
    else {
      sq_move(v,(HSQUIRRELVM)v_00.pTable,-1);
      SVar4 = 1;
      sq_settop((HSQUIRRELVM)v_00.pTable,newtop);
    }
  }
  else {
    SVar4 = sq_throwerror(v,"wrong parameter");
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_38);
  return SVar4;
}

Assistant:

static SQInteger thread_getstackinfos(HSQUIRRELVM v)
{
    SQObjectPtr o = stack_get(v,1);
    if(sq_type(o) == OT_THREAD) {
        SQVM *thread = _thread(o);
        SQInteger threadtop = sq_gettop(thread);
        SQInteger level;
        sq_getinteger(v,-1,&level);
        SQRESULT res = __sq_getcallstackinfos(thread,level);
        if(SQ_FAILED(res))
        {
            sq_settop(thread,threadtop);
            if(sq_type(thread->_lasterror) == OT_STRING) {
                sq_throwerror(v,_stringval(thread->_lasterror));
            }
            else {
                sq_throwerror(v,_SC("unknown error"));
            }
        }
        if(res > 0) {
            //some result
            sq_move(v,thread,-1);
            sq_settop(thread,threadtop);
            return 1;
        }
        //no result
        sq_settop(thread,threadtop);
        return 0;

    }
    return sq_throwerror(v,_SC("wrong parameter"));
}